

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::InterlockedResourceAccessPrepassHandler::handle
          (InterlockedResourceAccessPrepassHandler *this,Op op,uint32_t *param_2,uint32_t param_3)

{
  uint uVar1;
  CFG *this_00;
  bool bVar2;
  uint *puVar3;
  SPIRFunction *pSVar4;
  BlockID local_48;
  BlockID local_44 [2];
  uint32_t local_3c;
  bool outside_control_flow;
  CFG *pCStack_38;
  uint32_t from_block_id;
  CFG *cfg;
  uint32_t *puStack_28;
  uint32_t param_3_local;
  uint32_t *param_2_local;
  InterlockedResourceAccessPrepassHandler *pIStack_18;
  Op op_local;
  InterlockedResourceAccessPrepassHandler *this_local;
  
  if ((op == OpBeginInvocationInterlockEXT) || (op == OpEndInvocationInterlockEXT)) {
    cfg._4_4_ = param_3;
    puStack_28 = param_2;
    param_2_local._4_4_ = op;
    pIStack_18 = this;
    if ((this->interlock_function_id != 0) &&
       (uVar1 = this->interlock_function_id,
       puVar3 = VectorView<unsigned_int>::back(&(this->call_stack).super_VectorView<unsigned_int>),
       uVar1 != *puVar3)) {
      this->split_function_case = true;
      return false;
    }
    puVar3 = VectorView<unsigned_int>::back(&(this->call_stack).super_VectorView<unsigned_int>);
    this->interlock_function_id = *puVar3;
    pCStack_38 = get_cfg_for_function(this->compiler,this->interlock_function_id);
    pSVar4 = get<spirv_cross::SPIRFunction>(this->compiler,this->interlock_function_id);
    local_3c = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar4->entry_block);
    this_00 = pCStack_38;
    TypedID<(spirv_cross::Types)6>::TypedID(local_44,local_3c);
    TypedID<(spirv_cross::Types)6>::TypedID(&local_48,this->current_block_id);
    bVar2 = CFG::node_terminates_control_flow_in_sub_graph(this_00,local_44[0],local_48);
    if (!bVar2) {
      this->control_flow_interlock = true;
    }
  }
  return true;
}

Assistant:

bool Compiler::InterlockedResourceAccessPrepassHandler::handle(Op op, const uint32_t *, uint32_t)
{
	if (op == OpBeginInvocationInterlockEXT || op == OpEndInvocationInterlockEXT)
	{
		if (interlock_function_id != 0 && interlock_function_id != call_stack.back())
		{
			// Most complex case, we have no sensible way of dealing with this
			// other than taking the 100% conservative approach, exit early.
			split_function_case = true;
			return false;
		}
		else
		{
			interlock_function_id = call_stack.back();
			// If this call is performed inside control flow we have a problem.
			auto &cfg = compiler.get_cfg_for_function(interlock_function_id);

			uint32_t from_block_id = compiler.get<SPIRFunction>(interlock_function_id).entry_block;
			bool outside_control_flow = cfg.node_terminates_control_flow_in_sub_graph(from_block_id, current_block_id);
			if (!outside_control_flow)
				control_flow_interlock = true;
		}
	}
	return true;
}